

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

void cfd::api::json::ElementsDecodeRawTransactionTxIn::CollectFieldName(void)

{
  bool bVar1;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>_>_>,_bool>
  pVar2;
  CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn> func_table;
  CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn> *in_stack_fffffffffffff8c8;
  CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn> *in_stack_fffffffffffff8d0;
  CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn> *this;
  char (*in_stack_fffffffffffff8d8) [14];
  char (*__args) [9];
  function<void_(cfd::api::json::ElementsDecodeRawTransactionTxIn_&,_const_UniValue_&)>
  *in_stack_fffffffffffff8e0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>_>_>_>
  *this_00;
  CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn> local_5c1;
  allocator local_529;
  value_type local_528;
  _Base_ptr local_508;
  undefined1 local_500;
  allocator local_491;
  value_type local_490;
  _Base_ptr local_470;
  undefined1 local_468;
  allocator local_3f9;
  value_type local_3f8;
  _Base_ptr local_3d8;
  undefined1 local_3d0;
  allocator local_361;
  value_type local_360;
  _Base_ptr local_340;
  undefined1 local_338;
  allocator local_2c9;
  value_type local_2c8;
  _Base_ptr local_2a8;
  undefined1 local_2a0;
  allocator local_231;
  value_type local_230;
  _Base_ptr local_210;
  undefined1 local_208;
  allocator local_199;
  value_type local_198;
  _Base_ptr local_178;
  undefined1 local_170;
  allocator local_101;
  value_type local_100;
  _Base_ptr local_e0;
  undefined1 local_d8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>_>_>_>
  local_60 [2];
  
  bVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>_>_>_>
          ::empty((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>_>_>_>
                   *)0x6aae73);
  if (bVar1) {
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>::
    CLASS_FUNCTION_TABLE(in_stack_fffffffffffff8d0);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeRawTransactionTxIn_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeRawTransactionTxIn_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxIn_&)>
                *)in_stack_fffffffffffff8e0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeRawTransactionTxIn_ptr
                *)in_stack_fffffffffffff8d8);
    std::function<void(cfd::api::json::ElementsDecodeRawTransactionTxIn&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeRawTransactionTxIn&,UniValue_const&),void>
              (in_stack_fffffffffffff8e0,
               (_func_void_ElementsDecodeRawTransactionTxIn_ptr_UniValue_ptr *)
               in_stack_fffffffffffff8d8);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff8e0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8d8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>::operator=
              (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>::
    ~CLASS_FUNCTION_TABLE(in_stack_fffffffffffff8d0);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>>>>
            ::
            emplace<char_const(&)[9],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>_>_>_>
                        *)in_stack_fffffffffffff8e0,(char (*) [9])in_stack_fffffffffffff8d8,
                       in_stack_fffffffffffff8d0);
    local_e0 = (_Base_ptr)pVar2.first._M_node;
    local_d8 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_100,"coinbase",&local_101);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeRawTransactionTxIn_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeRawTransactionTxIn_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxIn_&)>
                *)in_stack_fffffffffffff8e0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeRawTransactionTxIn_ptr
                *)in_stack_fffffffffffff8d8);
    std::function<void(cfd::api::json::ElementsDecodeRawTransactionTxIn&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeRawTransactionTxIn&,UniValue_const&),void>
              (in_stack_fffffffffffff8e0,
               (_func_void_ElementsDecodeRawTransactionTxIn_ptr_UniValue_ptr *)
               in_stack_fffffffffffff8d8);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff8e0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8d8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>::operator=
              (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>::
    ~CLASS_FUNCTION_TABLE(in_stack_fffffffffffff8d0);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>>>>
            ::
            emplace<char_const(&)[5],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>_>_>_>
                        *)in_stack_fffffffffffff8e0,(char (*) [5])in_stack_fffffffffffff8d8,
                       in_stack_fffffffffffff8d0);
    local_178 = (_Base_ptr)pVar2.first._M_node;
    local_170 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_198,"txid",&local_199);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeRawTransactionTxIn_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeRawTransactionTxIn_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxIn_&)>
                *)in_stack_fffffffffffff8e0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeRawTransactionTxIn_ptr
                *)in_stack_fffffffffffff8d8);
    std::function<void(cfd::api::json::ElementsDecodeRawTransactionTxIn&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeRawTransactionTxIn&,UniValue_const&),void>
              (in_stack_fffffffffffff8e0,
               (_func_void_ElementsDecodeRawTransactionTxIn_ptr_UniValue_ptr *)
               in_stack_fffffffffffff8d8);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff8e0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8d8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>::operator=
              (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>::
    ~CLASS_FUNCTION_TABLE(in_stack_fffffffffffff8d0);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>>>>
            ::
            emplace<char_const(&)[5],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>_>_>_>
                        *)in_stack_fffffffffffff8e0,(char (*) [5])in_stack_fffffffffffff8d8,
                       in_stack_fffffffffffff8d0);
    local_210 = (_Base_ptr)pVar2.first._M_node;
    local_208 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_230,"vout",&local_231);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeRawTransactionTxIn_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeRawTransactionTxIn_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxIn_&)>
                *)in_stack_fffffffffffff8e0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeRawTransactionTxIn_ptr
                *)in_stack_fffffffffffff8d8);
    std::function<void(cfd::api::json::ElementsDecodeRawTransactionTxIn&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeRawTransactionTxIn&,UniValue_const&),void>
              (in_stack_fffffffffffff8e0,
               (_func_void_ElementsDecodeRawTransactionTxIn_ptr_UniValue_ptr *)
               in_stack_fffffffffffff8d8);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff8e0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8d8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>::operator=
              (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>::
    ~CLASS_FUNCTION_TABLE(in_stack_fffffffffffff8d0);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>>>>
            ::
            emplace<char_const(&)[10],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>_>_>_>
                        *)in_stack_fffffffffffff8e0,(char (*) [10])in_stack_fffffffffffff8d8,
                       in_stack_fffffffffffff8d0);
    local_2a8 = (_Base_ptr)pVar2.first._M_node;
    local_2a0 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2c8,"scriptSig",&local_2c9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_2c8);
    std::__cxx11::string::~string((string *)&local_2c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeRawTransactionTxIn_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeRawTransactionTxIn_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxIn_&)>
                *)in_stack_fffffffffffff8e0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeRawTransactionTxIn_ptr
                *)in_stack_fffffffffffff8d8);
    std::function<void(cfd::api::json::ElementsDecodeRawTransactionTxIn&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeRawTransactionTxIn&,UniValue_const&),void>
              (in_stack_fffffffffffff8e0,
               (_func_void_ElementsDecodeRawTransactionTxIn_ptr_UniValue_ptr *)
               in_stack_fffffffffffff8d8);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff8e0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8d8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>::operator=
              (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>::
    ~CLASS_FUNCTION_TABLE(in_stack_fffffffffffff8d0);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>>>>
            ::
            emplace<char_const(&)[9],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>_>_>_>
                        *)in_stack_fffffffffffff8e0,(char (*) [9])in_stack_fffffffffffff8d8,
                       in_stack_fffffffffffff8d0);
    local_340 = (_Base_ptr)pVar2.first._M_node;
    local_338 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_360,"is_pegin",&local_361);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_360);
    std::__cxx11::string::~string((string *)&local_360);
    std::allocator<char>::~allocator((allocator<char> *)&local_361);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeRawTransactionTxIn_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeRawTransactionTxIn_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxIn_&)>
                *)in_stack_fffffffffffff8e0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeRawTransactionTxIn_ptr
                *)in_stack_fffffffffffff8d8);
    std::function<void(cfd::api::json::ElementsDecodeRawTransactionTxIn&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeRawTransactionTxIn&,UniValue_const&),void>
              (in_stack_fffffffffffff8e0,
               (_func_void_ElementsDecodeRawTransactionTxIn_ptr_UniValue_ptr *)
               in_stack_fffffffffffff8d8);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff8e0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8d8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>::operator=
              (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>::
    ~CLASS_FUNCTION_TABLE(in_stack_fffffffffffff8d0);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>>>>
            ::
            emplace<char_const(&)[9],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>_>_>_>
                        *)in_stack_fffffffffffff8e0,(char (*) [9])in_stack_fffffffffffff8d8,
                       in_stack_fffffffffffff8d0);
    local_3d8 = (_Base_ptr)pVar2.first._M_node;
    local_3d0 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3f8,"sequence",&local_3f9);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_3f8);
    std::__cxx11::string::~string((string *)&local_3f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeRawTransactionTxIn_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeRawTransactionTxIn_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxIn_&)>
                *)in_stack_fffffffffffff8e0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeRawTransactionTxIn_ptr
                *)in_stack_fffffffffffff8d8);
    std::function<void(cfd::api::json::ElementsDecodeRawTransactionTxIn&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeRawTransactionTxIn&,UniValue_const&),void>
              (in_stack_fffffffffffff8e0,
               (_func_void_ElementsDecodeRawTransactionTxIn_ptr_UniValue_ptr *)
               in_stack_fffffffffffff8d8);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff8e0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8d8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>::operator=
              (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>::
    ~CLASS_FUNCTION_TABLE(in_stack_fffffffffffff8d0);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>>>>
            ::
            emplace<char_const(&)[12],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>_>_>_>
                        *)in_stack_fffffffffffff8e0,(char (*) [12])in_stack_fffffffffffff8d8,
                       in_stack_fffffffffffff8d0);
    local_470 = (_Base_ptr)pVar2.first._M_node;
    local_468 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_490,"txinwitness",&local_491);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_490);
    std::__cxx11::string::~string((string *)&local_490);
    std::allocator<char>::~allocator((allocator<char> *)&local_491);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeRawTransactionTxIn_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeRawTransactionTxIn_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxIn_&)>
                *)in_stack_fffffffffffff8e0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeRawTransactionTxIn_ptr
                *)in_stack_fffffffffffff8d8);
    std::function<void(cfd::api::json::ElementsDecodeRawTransactionTxIn&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeRawTransactionTxIn&,UniValue_const&),void>
              (in_stack_fffffffffffff8e0,
               (_func_void_ElementsDecodeRawTransactionTxIn_ptr_UniValue_ptr *)
               in_stack_fffffffffffff8d8);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff8e0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff8d8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>::operator=
              (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>::
    ~CLASS_FUNCTION_TABLE(in_stack_fffffffffffff8d0);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>>>>
            ::
            emplace<char_const(&)[14],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>&>
                      ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>_>_>_>
                        *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8,
                       in_stack_fffffffffffff8d0);
    local_508 = (_Base_ptr)pVar2.first._M_node;
    local_500 = pVar2.second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_528,"pegin_witness",&local_529);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,&local_528);
    std::__cxx11::string::~string((string *)&local_528);
    std::allocator<char>::~allocator((allocator<char> *)&local_529);
    __args = (char (*) [9])((long)&local_5c1.set_function.super__Function_base._M_manager + 1);
    std::function<std::__cxx11::string(cfd::api::json::ElementsDecodeRawTransactionTxIn_const&)>::
    function<std::__cxx11::string(&)(cfd::api::json::ElementsDecodeRawTransactionTxIn_const&),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cfd::api::json::ElementsDecodeRawTransactionTxIn_&)>
                *)in_stack_fffffffffffff8e0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ElementsDecodeRawTransactionTxIn_ptr
                *)__args);
    std::function<void(cfd::api::json::ElementsDecodeRawTransactionTxIn&,UniValue_const&)>::
    function<void(&)(cfd::api::json::ElementsDecodeRawTransactionTxIn&,UniValue_const&),void>
              (in_stack_fffffffffffff8e0,
               (_func_void_ElementsDecodeRawTransactionTxIn_ptr_UniValue_ptr *)__args);
    std::function<std::__cxx11::string()>::function<std::__cxx11::string(&)(),void>
              ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
                *)in_stack_fffffffffffff8e0,
               (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args);
    this_00 = local_60;
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>::operator=
              (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>::
    ~CLASS_FUNCTION_TABLE(in_stack_fffffffffffff8d0);
    pVar2 = std::
            map<std::__cxx11::string,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>>>>
            ::
            emplace<char_const(&)[9],cfd::core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>&>
                      (this_00,__args,in_stack_fffffffffffff8d0);
    local_5c1.set_function.super__Function_base._M_functor._1_8_ = pVar2.first._M_node;
    local_5c1.set_function.super__Function_base._M_functor._M_pod_data[9] = pVar2.second;
    this = &local_5c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               ((long)local_5c1.get_function.super__Function_base._M_functor._M_pod_data + 1),
               "issuance",(allocator *)this);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)item_list_abi_cxx11_,
                (value_type *)
                ((long)local_5c1.get_function.super__Function_base._M_functor._M_pod_data + 1));
    std::__cxx11::string::~string
              ((string *)
               ((long)local_5c1.get_function.super__Function_base._M_functor._M_pod_data + 1));
    std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
    core::CLASS_FUNCTION_TABLE<cfd::api::json::ElementsDecodeRawTransactionTxIn>::
    ~CLASS_FUNCTION_TABLE(this);
  }
  return;
}

Assistant:

void ElementsDecodeRawTransactionTxIn::CollectFieldName() {
  if (!json_mapper.empty()) {
    return;
  }
  cfd::core::CLASS_FUNCTION_TABLE<ElementsDecodeRawTransactionTxIn> func_table;  // NOLINT

  func_table = {
    ElementsDecodeRawTransactionTxIn::GetCoinbaseString,
    ElementsDecodeRawTransactionTxIn::SetCoinbaseString,
    ElementsDecodeRawTransactionTxIn::GetCoinbaseFieldType,
  };
  json_mapper.emplace("coinbase", func_table);
  item_list.push_back("coinbase");
  func_table = {
    ElementsDecodeRawTransactionTxIn::GetTxidString,
    ElementsDecodeRawTransactionTxIn::SetTxidString,
    ElementsDecodeRawTransactionTxIn::GetTxidFieldType,
  };
  json_mapper.emplace("txid", func_table);
  item_list.push_back("txid");
  func_table = {
    ElementsDecodeRawTransactionTxIn::GetVoutString,
    ElementsDecodeRawTransactionTxIn::SetVoutString,
    ElementsDecodeRawTransactionTxIn::GetVoutFieldType,
  };
  json_mapper.emplace("vout", func_table);
  item_list.push_back("vout");
  func_table = {
    ElementsDecodeRawTransactionTxIn::GetScriptSigString,
    ElementsDecodeRawTransactionTxIn::SetScriptSigString,
    ElementsDecodeRawTransactionTxIn::GetScriptSigFieldType,
  };
  json_mapper.emplace("scriptSig", func_table);
  item_list.push_back("scriptSig");
  func_table = {
    ElementsDecodeRawTransactionTxIn::GetIs_peginString,
    ElementsDecodeRawTransactionTxIn::SetIs_peginString,
    ElementsDecodeRawTransactionTxIn::GetIs_peginFieldType,
  };
  json_mapper.emplace("is_pegin", func_table);
  item_list.push_back("is_pegin");
  func_table = {
    ElementsDecodeRawTransactionTxIn::GetSequenceString,
    ElementsDecodeRawTransactionTxIn::SetSequenceString,
    ElementsDecodeRawTransactionTxIn::GetSequenceFieldType,
  };
  json_mapper.emplace("sequence", func_table);
  item_list.push_back("sequence");
  func_table = {
    ElementsDecodeRawTransactionTxIn::GetTxinwitnessString,
    ElementsDecodeRawTransactionTxIn::SetTxinwitnessString,
    ElementsDecodeRawTransactionTxIn::GetTxinwitnessFieldType,
  };
  json_mapper.emplace("txinwitness", func_table);
  item_list.push_back("txinwitness");
  func_table = {
    ElementsDecodeRawTransactionTxIn::GetPegin_witnessString,
    ElementsDecodeRawTransactionTxIn::SetPegin_witnessString,
    ElementsDecodeRawTransactionTxIn::GetPegin_witnessFieldType,
  };
  json_mapper.emplace("pegin_witness", func_table);
  item_list.push_back("pegin_witness");
  func_table = {
    ElementsDecodeRawTransactionTxIn::GetIssuanceString,
    ElementsDecodeRawTransactionTxIn::SetIssuanceString,
    ElementsDecodeRawTransactionTxIn::GetIssuanceFieldType,
  };
  json_mapper.emplace("issuance", func_table);
  item_list.push_back("issuance");
}